

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StmListGenerator.cpp
# Opt level: O0

void __thiscall StmListGenerator::generate(StmListGenerator *this,ostream *output,ScName *stmName)

{
  bool bVar1;
  ScStateMap *this_00;
  mapped_type *pmVar2;
  ulong uVar3;
  const_reference pvVar4;
  reference pbVar5;
  ostream *poVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *stm;
  iterator __end2;
  iterator __begin2;
  ScNameSet *__range2;
  mapped_type *rootState;
  ScName *stmName_local;
  ostream *output_local;
  StmListGenerator *this_local;
  
  this_00 = ScModel::states_abi_cxx11_((this->super_AbstractGenerator).m_model);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ScState,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ScState>_>_>
           ::at(this_00,&ScModel::RootScName_abi_cxx11_);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::operator<<(output,"Note: discarding a state-machine name\n");
  }
  bVar1 = std::vector<ScRegion,_std::allocator<ScRegion>_>::empty(&pmVar2->regions);
  if (bVar1) {
    std::operator<<(output,"No state-machines found\n");
  }
  else {
    std::operator<<(output,"Available state-machines:\n");
    pvVar4 = std::vector<ScRegion,_std::allocator<ScRegion>_>::operator[](&pmVar2->regions,0);
    __end2 = std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&pvVar4->states);
    stm = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end(&pvVar4->states);
    while (bVar1 = std::operator!=(&__end2,(_Self *)&stm), bVar1) {
      pbVar5 = std::
               _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&__end2);
      poVar6 = std::operator<<(output,"    ");
      poVar6 = std::operator<<(poVar6,(string *)pbVar5);
      std::operator<<(poVar6,"\n");
      std::
      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end2);
    }
  }
  std::ostream::flush();
  return;
}

Assistant:

void StmListGenerator::generate(std::ostream &output, const ScName &stmName)
{
    const auto &rootState = m_model.states().at(ScModel::RootScName);

    if (!stmName.empty()) {
        output << "Note: discarding a state-machine name\n";
    }

    if (rootState.regions.empty()) {
        output << "No state-machines found\n";
    } else {
        output << "Available state-machines:\n";
        for (const auto &stm : rootState.regions[0].states) {
            output << "    " << stm << "\n";
        }
    }

    output.flush();
}